

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseIfExceptHeader(WastParser *this,IfExceptExpr *expr)

{
  void *pvVar1;
  bool bVar2;
  Result RVar3;
  TokenType TVar4;
  long lVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  Var local_f0;
  Location local_a8;
  undefined1 local_80 [8];
  Var var;
  
  bVar2 = PeekMatchLpar(this,Result);
  if ((bVar2) || (bVar2 = PeekMatchLpar(this,Param), bVar2)) {
    RVar3 = ParseBlockDeclaration(this,&(expr->true_).decl);
    if (RVar3.enum_ == Error) {
      return (Result)Error;
    }
    RVar3 = ParseVar(this,&expr->except_var);
  }
  else {
    TVar4 = Peek(this,0);
    if (TVar4 != Last_Literal) {
      TVar4 = Peek(this,0);
      if (TVar4 != Last_String) {
        local_80 = (undefined1  [8])&var.loc.filename.size_;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"a var","");
        var.loc.field_1._8_8_ = &var.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)((long)&var.loc.field_1 + 8),"a block type","");
        __l._M_len = 2;
        __l._M_array = (iterator)local_80;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_a8,__l,(allocator_type *)((long)&var.field_2 + 0x1f));
        RVar3 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&local_a8,"12 or $foo or (result ...)");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_a8);
        lVar5 = 0;
        do {
          pvVar1 = *(void **)((long)&var.loc.field_1 + lVar5 + 8);
          if ((void *)((long)&var.field_2 + lVar5) != pvVar1) {
            operator_delete(pvVar1);
          }
          lVar5 = lVar5 + -0x20;
        } while (lVar5 != -0x40);
        return (Result)RVar3.enum_;
      }
      local_a8.field_1.field_0.line = 0;
      local_a8.field_1._4_8_ = 0;
      local_a8.filename.data_ = (char *)0x0;
      local_a8.filename.size_._0_4_ = 0;
      local_a8.filename.size_._4_4_ = 0;
      Var::Var((Var *)local_80,0xffffffff,&local_a8);
      RVar3 = ParseVar(this,(Var *)local_80);
      if (RVar3.enum_ != Error) {
        bVar2 = PeekMatchLpar(this,Result);
        if ((!bVar2) && (bVar2 = PeekMatchLpar(this,Param), !bVar2)) {
          local_a8.field_1.field_0.line = 0;
          local_a8.field_1._4_8_ = 0;
          local_a8.filename.data_ = (char *)0x0;
          local_a8.filename.size_._0_4_ = 0;
          local_a8.filename.size_._4_4_ = 0;
          Var::Var(&local_f0,0xffffffff,&local_a8);
          bVar2 = ParseVarOpt(this,&expr->except_var,&local_f0);
          Var::~Var(&local_f0);
          if (bVar2) {
            if (var.loc.field_1.field_0.last_column != 1) goto LAB_00f752c8;
            std::__cxx11::string::_M_assign((string *)&expr->true_,(string *)&var.type_);
          }
          else {
            Var::operator=(&expr->except_var,(Var *)local_80);
          }
          Var::~Var((Var *)local_80);
          return (Result)Ok;
        }
        if (var.loc.field_1.field_0.last_column != 1) {
LAB_00f752c8:
          __assert_fail("is_name()",
                        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/ir.h"
                        ,0x37,"const std::string &wabt::Var::name() const");
        }
        std::__cxx11::string::_M_assign((string *)&expr->true_,(string *)&var.type_);
        RVar3 = ParseBlockDeclaration(this,&(expr->true_).decl);
        if (RVar3.enum_ != Error) {
          RVar3 = ParseVar(this,&expr->except_var);
          Var::~Var((Var *)local_80);
          goto joined_r0x00f750a8;
        }
      }
      Var::~Var((Var *)local_80);
      return (Result)Error;
    }
    RVar3 = ParseVar(this,&expr->except_var);
  }
joined_r0x00f750a8:
  if (RVar3.enum_ != Error) {
    return (Result)Ok;
  }
  return (Result)Error;
}

Assistant:

Result WastParser::ParseIfExceptHeader(IfExceptExpr* expr) {
  WABT_TRACE(ParseIfExceptHeader);
  // if_except has the syntax:
  //
  //     if_except label_opt block_type except_index
  //
  // This means that it can have a few different forms:
  //
  //     1. if_except <num> ...
  //     2. if_except $except ...
  //     3. if_except $label $except/<num> ...
  //     4. if_except (result...) $except/<num> ...
  //     5. if_except $label (result...) $except/<num> ...
  //
  // With the multi-value proposal, `block_type` can be (param...) (result...),
  // so there are more forms:
  //
  //     6. if_except (param...) $except/<num> ...
  //     7. if_except (param...) (result...) $except/<num> ...
  //     8. if_except $label (param...) $except/<num> ...
  //     9. if_except $label (param...) (result...) $except/<num> ...
  //
  // This case is handled by ParseBlockDeclaration, but it means we also need
  // to check for the `param` token here.

  if (PeekMatchLpar(TokenType::Result) || PeekMatchLpar(TokenType::Param)) {
    // Cases 4, 6, 7.
    CHECK_RESULT(ParseBlockDeclaration(&expr->true_.decl));
    CHECK_RESULT(ParseVar(&expr->except_var));
  } else if (PeekMatch(TokenType::Nat)) {
    // Case 1.
    CHECK_RESULT(ParseVar(&expr->except_var));
  } else if (PeekMatch(TokenType::Var)) {
    // Cases 2, 3, 5, 8, 9.
    Var var;
    CHECK_RESULT(ParseVar(&var));
    if (PeekMatchLpar(TokenType::Result) || PeekMatchLpar(TokenType::Param)) {
      // Cases 5, 8, 9.
      expr->true_.label = var.name();
      CHECK_RESULT(ParseBlockDeclaration(&expr->true_.decl));
      CHECK_RESULT(ParseVar(&expr->except_var));
    } else if (ParseVarOpt(&expr->except_var, Var())) {
      // Case 3.
      expr->true_.label = var.name();
    } else {
      // Case 2.
      expr->except_var = var;
    }
  } else {
    return ErrorExpected({"a var", "a block type"},
                         "12 or $foo or (result ...)");
  }

  return Result::Ok;
}